

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cimod::
BinaryPolynomialModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
::GenerateSortedVariables
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,
          BinaryPolynomialModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
          *this)

{
  allocator_type local_11;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__detail::_Node_const_iterator<std::__cxx11::string,true,true>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,
             (_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )(this->variables_)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )0x0,&local_11);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

std::vector<IndexType> GenerateSortedVariables() const {
      std::vector<IndexType> sorted_variables( variables_.begin(), variables_.end() );
      std::sort( sorted_variables.begin(), sorted_variables.end() );
      return sorted_variables;
    }